

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strdup2.c
# Opt level: O0

char * upb_strdup2(char *s,size_t len,upb_Arena *a)

{
  char *p;
  size_t n;
  upb_Arena *a_local;
  size_t len_local;
  char *s_local;
  
  if (len == 0xffffffffffffffff) {
    s_local = (char *)0x0;
  }
  else {
    s_local = (char *)upb_Arena_Malloc(a,len + 1);
    if (s_local != (char *)0x0) {
      if (len != 0) {
        memcpy(s_local,s,len);
      }
      s_local[len] = '\0';
    }
  }
  return s_local;
}

Assistant:

char* upb_strdup2(const char* s, size_t len, upb_Arena* a) {
  size_t n;
  char* p;

  // Prevent overflow errors.
  if (len == SIZE_MAX) return NULL;

  // Always null-terminate, even if binary data; but don't rely on the input to
  // have a null-terminating byte since it may be a raw binary buffer.
  n = len + 1;
  p = upb_Arena_Malloc(a, n);
  if (p) {
    if (len != 0) memcpy(p, s, len);
    p[len] = 0;
  }
  return p;
}